

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_file_readAsString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue val;
  JSValue JVar1;
  int iVar2;
  FILE *__stream;
  int in_ECX;
  JSValueUnion *in_R8;
  JSValue JVar3;
  JSValue max_size_val;
  size_t max_size;
  uint64_t max_size64;
  JSValue obj;
  DynBuf dbuf;
  int c;
  FILE *f;
  undefined1 in_stack_ffffffffffffff38 [16];
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  JSValueUnion in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  JSValueUnion ctx_00;
  JSValueUnion JVar4;
  ulong uVar5;
  ulong local_90;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  JSContext *in_stack_ffffffffffffffa0;
  undefined4 local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  JVar3.tag = in_stack_ffffffffffffff58;
  JVar3.u.ptr = in_stack_ffffffffffffff50.ptr;
  __stream = (FILE *)js_std_file_get((JSContext *)
                                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                     JVar3);
  if (__stream == (FILE *)0x0) {
    local_10 = 0;
    local_8 = 6;
  }
  else {
    if (in_ECX < 1) {
      in_stack_ffffffffffffff50.float64 = 1.48219693752374e-323;
      ctx_00.ptr = (void *)((ulong)in_stack_ffffffffffffff4c << 0x20);
      JVar4.float64 = 1.48219693752374e-323;
    }
    else {
      ctx_00 = (JSValueUnion)in_R8->ptr;
      JVar4 = (JSValueUnion)in_R8[1].ptr;
    }
    uVar5 = 0xffffffffffffffff;
    v.tag = (int64_t)JVar4.ptr;
    v.u.ptr = ctx_00.ptr;
    iVar2 = JS_IsUndefined(v);
    if (iVar2 == 0) {
      val.tag = uVar5;
      val.u.ptr = JVar4.ptr;
      iVar2 = JS_ToIndex((JSContext *)ctx_00.ptr,(uint64_t *)in_stack_ffffffffffffff50.ptr,val);
      if (iVar2 != 0) {
        local_10 = 0;
        local_8 = 6;
        goto LAB_0010f623;
      }
      if (local_90 < uVar5) {
        uVar5 = local_90;
      }
    }
    js_std_dbuf_init(in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38._0_8_);
    while ((uVar5 != 0 && (iVar2 = fgetc(__stream), iVar2 != -1))) {
      iVar2 = dbuf_putc(in_stack_ffffffffffffff38._8_8_,in_stack_ffffffffffffff38[7]);
      if (iVar2 != 0) {
        dbuf_free((DynBuf *)0x10f5a3);
        local_10 = 0;
        local_8 = 6;
        goto LAB_0010f623;
      }
      uVar5 = uVar5 - 1;
    }
    JVar3 = JS_NewStringLen(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffff90);
    local_8 = JVar3.tag;
    dbuf_free((DynBuf *)0x10f609);
    local_10 = JVar3.u._0_4_;
    uStack_c = JVar3.u._4_4_;
  }
LAB_0010f623:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_std_file_readAsString(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    FILE *f = js_std_file_get(ctx, this_val);
    int c;
    DynBuf dbuf;
    JSValue obj;
    uint64_t max_size64;
    size_t max_size;
    JSValueConst max_size_val;
    
    if (!f)
        return JS_EXCEPTION;

    if (argc >= 1)
        max_size_val = argv[0];
    else
        max_size_val = JS_UNDEFINED;
    max_size = (size_t)-1;
    if (!JS_IsUndefined(max_size_val)) {
        if (JS_ToIndex(ctx, &max_size64, max_size_val))
            return JS_EXCEPTION;
        if (max_size64 < max_size)
            max_size = max_size64;
    }

    js_std_dbuf_init(ctx, &dbuf);
    while (max_size != 0) {
        c = fgetc(f);
        if (c == EOF)
            break;
        if (dbuf_putc(&dbuf, c)) {
            dbuf_free(&dbuf);
            return JS_EXCEPTION;
        }
        max_size--;
    }
    obj = JS_NewStringLen(ctx, (const char *)dbuf.buf, dbuf.size);
    dbuf_free(&dbuf);
    return obj;
}